

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Volume.h
# Opt level: O3

grid_iterator<float> *
idx2::Begin<float>(grid_iterator<float> *__return_storage_ptr__,grid *Grid,volume *Vol)

{
  u64 uVar1;
  u64 uVar2;
  int iVar3;
  long lVar4;
  uint uVar5;
  anon_union_8_4_6ba14846_for_v2<int>_1 aVar6;
  
  uVar1 = Grid->Strd;
  uVar5 = (uint)((long)(uVar1 << 0x2b) >> 0x2b);
  (__return_storage_ptr__->S).field_0.field_3.XY.field_0 =
       (anon_union_8_4_6ba14846_for_v2<int>_1)
       ((long)(uVar1 << 0x16) >> 0xb & 0xffffffff00000000U | (ulong)uVar5);
  iVar3 = (int)((long)(uVar1 * 2) >> 0x2b);
  (__return_storage_ptr__->S).field_0.field_0.Z = iVar3;
  uVar2 = (Grid->super_extent).Dims;
  aVar6.field_0.Y = (int)((long)(uVar2 << 0x16) >> 0x2b) * (int)((long)(uVar1 << 0x16) >> 0x2b);
  aVar6.field_0.X = (((int)uVar2 << 0xb) >> 0xb) * uVar5;
  (__return_storage_ptr__->D).field_0.field_3.XY.field_0 = aVar6;
  (__return_storage_ptr__->D).field_0.field_0.Z = (int)((long)(uVar2 * 2) >> 0x2b) * iVar3;
  (__return_storage_ptr__->P).field_0.field_3.XY.field_0 =
       (anon_union_8_4_6ba14846_for_v2<int>_1)0x0;
  (__return_storage_ptr__->P).field_0.field_0.Z = 0;
  uVar1 = Vol->Dims;
  lVar4 = (long)(uVar1 << 0x2b) >> 0x2b;
  (__return_storage_ptr__->N).field_0.field_3.XY.field_0 =
       (anon_union_8_4_6ba14846_for_v2<int>_1)
       ((long)(uVar1 << 0x16) >> 0xb & 0xffffffff00000000U |
       (ulong)(uint)((long)(uVar1 << 0x2b) >> 0x2b));
  (__return_storage_ptr__->N).field_0.field_0.Z = (int)((long)(uVar1 * 2) >> 0x2b);
  uVar2 = (Grid->super_extent).From;
  __return_storage_ptr__->Ptr =
       (float *)((Vol->Buffer).Data +
                ((long)(uVar2 << 0x2b) >> 0x29) +
                ((long)(uVar2 << 0x16) >> 0x2b) * lVar4 * 4 +
                ((long)(uVar1 << 0x16) >> 0x2b) * ((long)(uVar2 * 2) >> 0x2b) * lVar4 * 4);
  return __return_storage_ptr__;
}

Assistant:

grid_iterator<t>
Begin(const grid& Grid, const volume& Vol)
{
  grid_iterator<t> Iter;
  Iter.S = Strd(Grid);
  Iter.D = Dims(Grid) * Iter.S;
  Iter.P = v3i(0);
  Iter.N = Dims(Vol);
  Iter.Ptr = (t*)const_cast<byte*>(Vol.Buffer.Data) + Row(Iter.N, From(Grid));
  return Iter;
}